

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O3

cupdlp_bool PDHG_Check_Termination(CUPDLPwork *pdhg,int bool_print)

{
  CUPDLPsettings *pCVar1;
  CUPDLPresobj *pCVar2;
  CUPDLPscaling *pCVar3;
  CUPDLPsettings *pCVar4;
  cupdlp_float cVar5;
  
  pCVar1 = pdhg->settings;
  pCVar2 = pdhg->resobj;
  pCVar3 = pdhg->scaling;
  pCVar4 = pCVar1;
  if (bool_print != 0) {
    printf("Termination check: %e|%e  %e|%e  %e|%e\n",pCVar2->dPrimalFeas,
           (pCVar3->dNormRhs + 1.0) * pCVar1->dPrimalTol,pCVar2->dDualFeas,
           (pCVar3->dNormCost + 1.0) * pCVar1->dDualTol,pCVar2->dRelObjGap,pCVar1->dGapTol);
    pCVar4 = pdhg->settings;
  }
  if (pCVar4->iInfNormAbsLocalTermination == 0) {
    if (pCVar1->dPrimalTol * (pCVar3->dNormRhs + 1.0) <= pCVar2->dPrimalFeas) {
      return false;
    }
    cVar5 = (pCVar3->dNormCost + 1.0) * pCVar1->dDualTol;
  }
  else {
    if (pCVar1->dPrimalTol <= pCVar2->dPrimalFeas) {
      return false;
    }
    cVar5 = pCVar1->dDualTol;
  }
  if (cVar5 < pCVar2->dDualFeas || cVar5 == pCVar2->dDualFeas) {
    return false;
  }
  return pCVar2->dRelObjGap <= pCVar1->dGapTol && pCVar1->dGapTol != pCVar2->dRelObjGap;
}

Assistant:

cupdlp_bool PDHG_Check_Termination(CUPDLPwork *pdhg, int bool_print) {
  CUPDLPproblem *problem = pdhg->problem;
  CUPDLPsettings *settings = pdhg->settings;
  CUPDLPresobj *resobj = pdhg->resobj;
  CUPDLPscaling *scaling = pdhg->scaling;
#if PDHG_DISPLAY_TERMINATION_CHECK
  // todo, check, is it correct
  if (bool_print) {
    cupdlp_printf(
        "Termination check: %e|%e  %e|%e  %e|%e\n", resobj->dPrimalFeas,
        settings->dPrimalTol * (1.0 + scaling->dNormRhs), resobj->dDualFeas,
        settings->dDualTol * (1.0 + scaling->dNormCost), resobj->dRelObjGap,
        settings->dGapTol);
  }

#endif
  int bool_pass = 0;
  if (pdhg->settings->iInfNormAbsLocalTermination) {
    bool_pass =
      (resobj->dPrimalFeas < settings->dPrimalTol) &&
      (resobj->dDualFeas < settings->dDualTol);
  } else {
    bool_pass =
      (resobj->dPrimalFeas < settings->dPrimalTol * (1.0 + scaling->dNormRhs)) &&
      (resobj->dDualFeas < settings->dDualTol * (1.0 + scaling->dNormCost));
  }
  bool_pass = bool_pass && (resobj->dRelObjGap < settings->dGapTol);
  return bool_pass;
}